

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O2

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateBooleanElementwiseLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  uint32_t uVar1;
  bool bVar2;
  
  uVar1 = layer->_oneof_case_[0];
  if (((uVar1 == 0x348) || (uVar1 == 0x34d)) || (uVar1 == 0x357)) {
    validateInputCount(__return_storage_ptr__,layer,2,2);
    bVar2 = Result::good(__return_storage_ptr__);
  }
  else if (uVar1 == 0x352) {
    validateInputCount(__return_storage_ptr__,layer,1,1);
    bVar2 = Result::good(__return_storage_ptr__);
  }
  else {
    validateInputCount(__return_storage_ptr__,layer,1,2);
    bVar2 = Result::good(__return_storage_ptr__);
  }
  if (bVar2 != false) {
    std::__cxx11::string::~string((string *)&__return_storage_ptr__->m_message);
    validateOutputCount(__return_storage_ptr__,layer,1,1);
    bVar2 = Result::good(__return_storage_ptr__);
    if (bVar2) {
      std::__cxx11::string::~string((string *)&__return_storage_ptr__->m_message);
      Result::Result(__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateBooleanElementwiseLayer(const Specification::NeuralNetworkLayer& layer) {
    if (layer.layer_case() == CoreML::Specification::NeuralNetworkLayer::kLogicalNot) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 1));
    } else if (layer.layer_case() == CoreML::Specification::NeuralNetworkLayer::kLogicalAnd ||
               layer.layer_case() == CoreML::Specification::NeuralNetworkLayer::kLogicalOr ||
               layer.layer_case() == CoreML::Specification::NeuralNetworkLayer::kLogicalXor) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 2, 2));
    } else {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 2));
    }

    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));
    return Result();
}